

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O0

int __thiscall
ncnn::InnerProduct::forward(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  long in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  long in_RDI;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int i_1;
  float *m_1;
  float *w_1;
  Mat *in_stack_000000b0;
  int q;
  float sum_1;
  int p_1;
  int i;
  float sum;
  float *kptr;
  int p;
  float *outptr;
  float *m;
  int j;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  int num_input;
  float upper_1;
  float lower_1;
  float beta_1;
  float alpha_1;
  float max_1;
  float min_1;
  float slope_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  float fVar8;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  size_t in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  int iVar9;
  Mat *this_00;
  Mat *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  int local_140;
  Mat local_130;
  Mat *local_e8;
  float *local_e0;
  int local_d4;
  float local_d0;
  int local_cc;
  int local_c8;
  float local_c4;
  float *local_c0;
  int local_b4;
  float *local_b0;
  float *local_a8;
  int local_a0;
  int local_9c;
  size_t local_98;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  Mat *local_78;
  Mat *local_70;
  int local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  Mat *local_40;
  undefined4 local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  Mat *local_10;
  undefined4 local_8;
  float local_4;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  
  if (((*(byte *)(in_RCX + 0x1e) & 1) == 0) || (*(long *)(in_RDI + 0x140) != 1)) {
    local_84 = *(int *)(in_RDI + 0xd8) / *(int *)(in_RDI + 0xd0);
    local_88 = in_RSI->w;
    local_8c = in_RSI->h;
    local_90 = in_RSI->c;
    local_98 = in_RSI->elemsize;
    local_9c = local_88 * local_8c;
    iVar9 = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
    local_78 = in_RDX;
    if ((in_RSI->dims == 2) && ((local_88 == local_84 && (1 < local_8c)))) {
      local_70 = in_RSI;
      ncnn::Mat::create(in_stack_fffffffffffffea0,iVar9,(int)in_stack_fffffffffffffe98,
                        in_stack_fffffffffffffe90,
                        (Allocator *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80))
      ;
      if (bVar1) {
        local_60 = -100;
      }
      else {
        for (local_a0 = 0; local_a0 < local_8c; local_a0 = local_a0 + 1) {
          local_a8 = ncnn::Mat::row(local_70,local_a0);
          local_b0 = ncnn::Mat::row(local_78,local_a0);
          for (local_b4 = 0; local_b4 < *(int *)(in_RDI + 0xd0); local_b4 = local_b4 + 1) {
            local_c0 = ncnn::Mat::operator_cast_to_float_((Mat *)(in_RDI + 0x130));
            local_c0 = local_c0 + local_88 * local_b4;
            local_c4 = 0.0;
            if (*(int *)(in_RDI + 0xd4) != 0) {
              pfVar2 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x178),(long)local_b4);
              local_c4 = *pfVar2;
            }
            for (local_c8 = 0; local_c8 < local_88; local_c8 = local_c8 + 1) {
              local_c4 = local_a8[local_c8] * local_c0[local_c8] + local_c4;
            }
            local_8 = *(undefined4 *)(in_RDI + 0xe0);
            local_10 = (Mat *)(in_RDI + 0xe8);
            local_4 = local_c4;
            switch(local_8) {
            case 1:
              dVar3 = std::fmax((double)(ulong)(uint)local_c4,0.0);
              local_4 = SUB84(dVar3,0);
              break;
            case 2:
              pfVar2 = ncnn::Mat::operator[](local_10,0);
              local_14 = *pfVar2;
              if (local_4 <= 0.0) {
                local_4 = local_4 * local_14;
              }
              break;
            case 3:
              pfVar2 = ncnn::Mat::operator[](local_10,0);
              local_18 = *pfVar2;
              pfVar2 = ncnn::Mat::operator[](local_10,1);
              local_1c = *pfVar2;
              if (local_4 < local_18) {
                local_4 = local_18;
              }
              if (local_1c < local_4) {
                local_4 = local_1c;
              }
              break;
            case 4:
              dVar3 = std::exp((double)(ulong)(uint)-local_c4);
              local_4 = 1.0 / (SUB84(dVar3,0) + 1.0);
              break;
            case 5:
              fVar8 = local_c4;
              auVar4._0_8_ = std::exp((double)(ulong)(uint)local_c4);
              auVar4._8_8_ = extraout_XMM0_Qb;
              auVar5._4_12_ = auVar4._4_12_;
              auVar5._0_4_ = SUB84(auVar4._0_8_,0) + 1.0;
              dVar3 = std::log(auVar5._0_8_);
              dVar3 = std::tanh(dVar3);
              local_4 = fVar8 * SUB84(dVar3,0);
              break;
            case 6:
              pfVar2 = ncnn::Mat::operator[](local_10,0);
              local_20 = *pfVar2;
              pfVar2 = ncnn::Mat::operator[](local_10,1);
              local_24 = *pfVar2;
              local_28 = -local_24 / local_20;
              local_2c = 1.0 / local_20 + local_28;
              if (local_28 <= local_4) {
                if (local_4 <= local_2c) {
                  local_4 = local_4 * (local_4 * local_20 + local_24);
                }
              }
              else {
                local_4 = 0.0;
              }
            }
            local_b0[local_b4] = local_4;
          }
        }
        local_60 = 0;
      }
    }
    else {
      ncnn::Mat::create(in_stack_fffffffffffffea0,iVar9,in_stack_fffffffffffffe90,
                        (Allocator *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80))
      ;
      if (bVar1) {
        local_60 = -100;
      }
      else {
        for (local_cc = 0; local_cc < *(int *)(in_RDI + 0xd0); local_cc = local_cc + 1) {
          local_d0 = 0.0;
          if (*(int *)(in_RDI + 0xd4) != 0) {
            pfVar2 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x178),(long)local_cc);
            local_d0 = *pfVar2;
          }
          for (local_d4 = 0; iVar9 = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20),
              local_d4 < local_90; local_d4 = local_d4 + 1) {
            local_e0 = ncnn::Mat::operator_cast_to_float_((Mat *)(in_RDI + 0x130));
            local_e0 = local_e0 +
                       (long)(local_9c * local_90 * local_cc) + (long)(local_9c * local_d4);
            this_00 = &local_130;
            ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                               iVar9);
            in_stack_fffffffffffffea0 = (Mat *)ncnn::Mat::operator_cast_to_float_(this_00);
            ncnn::Mat::~Mat((Mat *)0x398780);
            for (local_140 = 0; local_140 < local_9c; local_140 = local_140 + 1) {
              local_d0 = *(float *)((long)&in_stack_fffffffffffffea0->data + (long)local_140 * 4) *
                         local_e0[local_140] + local_d0;
            }
            local_e8 = in_stack_fffffffffffffea0;
          }
          local_34 = *(undefined4 *)(in_RDI + 0xe0);
          local_40 = (Mat *)(in_RDI + 0xe8);
          local_30 = local_d0;
          switch(local_34) {
          case 1:
            dVar3 = std::fmax((double)(ulong)(uint)local_d0,0.0);
            local_30 = SUB84(dVar3,0);
            break;
          case 2:
            pfVar2 = ncnn::Mat::operator[](local_40,0);
            local_44 = *pfVar2;
            if (local_30 <= 0.0) {
              local_30 = local_30 * local_44;
            }
            break;
          case 3:
            pfVar2 = ncnn::Mat::operator[](local_40,0);
            local_48 = *pfVar2;
            pfVar2 = ncnn::Mat::operator[](local_40,1);
            local_4c = *pfVar2;
            if (local_30 < local_48) {
              local_30 = local_48;
            }
            if (local_4c < local_30) {
              local_30 = local_4c;
            }
            break;
          case 4:
            dVar3 = std::exp((double)(ulong)(uint)-local_d0);
            local_30 = 1.0 / (SUB84(dVar3,0) + 1.0);
            break;
          case 5:
            fVar8 = local_d0;
            auVar6._0_8_ = std::exp((double)(ulong)(uint)local_d0);
            auVar6._8_8_ = extraout_XMM0_Qb_00;
            auVar7._4_12_ = auVar6._4_12_;
            auVar7._0_4_ = SUB84(auVar6._0_8_,0) + 1.0;
            dVar3 = std::log(auVar7._0_8_);
            dVar3 = std::tanh(dVar3);
            local_30 = fVar8 * SUB84(dVar3,0);
            break;
          case 6:
            pfVar2 = ncnn::Mat::operator[](local_40,0);
            local_50 = *pfVar2;
            pfVar2 = ncnn::Mat::operator[](local_40,1);
            local_54 = *pfVar2;
            local_58 = -local_54 / local_50;
            local_5c = 1.0 / local_50 + local_58;
            if (local_58 <= local_30) {
              if (local_30 <= local_5c) {
                local_30 = local_30 * (local_30 * local_50 + local_54);
              }
            }
            else {
              local_30 = 0.0;
            }
          }
          fVar8 = local_30;
          pfVar2 = ncnn::Mat::operator[](local_78,(long)local_cc);
          *pfVar2 = fVar8;
        }
        local_60 = 0;
      }
    }
  }
  else {
    local_60 = forward_int8(_i,_sum_1,in_stack_000000b0,(Option *)w_1);
  }
  return local_60;
}

Assistant:

int InnerProduct::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    if (bottom_blob.dims == 2 && w == num_input && h > 1)
    {
        // gemm
        top_blob.create(num_output, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const float* m = bottom_blob.row(j);
            float* outptr = top_blob.row(j);

            for (int p = 0; p < num_output; p++)
            {
                const float* kptr = (const float*)weight_data + w * p;

                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                for (int i = 0; i < w; i++)
                {
                    sum += m[i] * kptr[i];
                }

                outptr[p] = activation_ss(sum, activation_type, activation_params);
            }
        }

        return 0;
    }

    top_blob.create(num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        float sum = 0.f;

        if (bias_term)
            sum = bias_data[p];

        // channels
        for (int q = 0; q < channels; q++)
        {
            const float* w = (const float*)weight_data + size * channels * p + size * q;
            const float* m = bottom_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        top_blob[p] = activation_ss(sum, activation_type, activation_params);
    }

    return 0;
}